

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O1

ostream * pstore::operator<<(ostream *os,address *addr)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"{s:",3);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," +:",3);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}",1);
  return poVar1;
}

Assistant:

std::ostream & operator<< (std::ostream & os, address const & addr) {
        return os << "{s:" << addr.segment () << " +:" << addr.offset () << "}";
    }